

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O1

void __thiscall FIX::FileLog::~FileLog(FileLog *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 uVar4;
  
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__FileLog_001f8ad0;
  std::ofstream::close();
  std::ofstream::close();
  pcVar2 = (this->m_fullBackupPrefix)._M_dataplus._M_p;
  paVar1 = &(this->m_fullBackupPrefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_fullPrefix)._M_dataplus._M_p;
  paVar1 = &(this->m_fullPrefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_eventFileName)._M_dataplus._M_p;
  paVar1 = &(this->m_eventFileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_messagesFileName)._M_dataplus._M_p;
  paVar1 = &(this->m_messagesFileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  uVar4 = _strtod;
  lVar3 = _VTT;
  *(long *)&this->m_event = _VTT;
  *(undefined8 *)(&this->m_event + *(long *)(lVar3 + -0x18)) = uVar4;
  std::filebuf::~filebuf((filebuf *)&this->field_0x210);
  std::ios_base::~ios_base((ios_base *)&this->field_0x300);
  *(long *)&this->m_messages = lVar3;
  *(undefined8 *)(&this->m_messages + *(long *)(lVar3 + -0x18)) = uVar4;
  std::filebuf::~filebuf((filebuf *)&this->field_0x10);
  std::ios_base::~ios_base((ios_base *)&this->field_0x100);
  return;
}

Assistant:

FileLog::~FileLog() {
  m_messages.close();
  m_event.close();
}